

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_stream.hpp
# Opt level: O1

void __thiscall
cfgfile::input_stream_t<cfgfile::string_trait_t>::put_back
          (input_stream_t<cfgfile::string_trait_t> *this,char_t ch)

{
  iterator *piVar1;
  char_t *pcVar2;
  _Elt_pointer ppVar3;
  char_t local_19;
  undefined8 local_18;
  pos_t pStack_10;
  
  ppVar3 = (this->m_prev_positions).c.
           super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVar3 != (this->m_prev_positions).c.
                super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    if (ppVar3 == (this->m_prev_positions).c.
                  super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppVar3 = (this->m_prev_positions).c.
               super__Deque_base<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    local_18 = ppVar3[-1].m_column_number;
    pStack_10 = ppVar3[-1].m_line_number;
    local_19 = ch;
    std::
    deque<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t,_std::allocator<cfgfile::input_stream_t<cfgfile::string_trait_t>::position_t>_>
    ::pop_back(&(this->m_prev_positions).c);
    *(undefined4 *)&this->m_line_number = (undefined4)pStack_10;
    *(undefined4 *)((long)&this->m_line_number + 4) = local_18._4_4_;
    *(undefined4 *)&this->m_column_number = (undefined4)local_18;
    *(undefined4 *)((long)&this->m_column_number + 4) = local_18._4_4_;
    pcVar2 = (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pcVar2 == (this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<char,std::allocator<char>>::_M_push_back_aux<char_const&>
                ((deque<char,std::allocator<char>> *)&this->m_returned_char,&local_19);
    }
    else {
      *pcVar2 = local_19;
      piVar1 = &(this->m_returned_char).c.super__Deque_base<char,_std::allocator<char>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
  }
  return;
}

Assistant:

void put_back( typename Trait::char_t ch )
	{
		if( !m_prev_positions.empty() )
		{
			const auto prev = m_prev_positions.top();
			m_prev_positions.pop();

			m_column_number = prev.m_column_number;
			m_line_number = prev.m_line_number;

			m_returned_char.push( ch );
		}
	}